

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void ly_ctx_set_module_imp_clb(ly_ctx *ctx,ly_module_imp_clb clb,void *user_data)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (ctx != (ly_ctx *)0x0) {
    ctx->imp_clb = clb;
    ctx->imp_clb_data = user_data;
    uVar2 = (ulong)(ctx->list).count;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        pbVar1 = (byte *)((long)&(ctx->list).field_2.dnodes[uVar3][2].schema + 2);
        *pbVar1 = *pbVar1 & 0xf7;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    return;
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
         "ly_ctx_set_module_imp_clb");
  return;
}

Assistant:

LIBYANG_API_DEF void
ly_ctx_set_module_imp_clb(struct ly_ctx *ctx, ly_module_imp_clb clb, void *user_data)
{
    LY_CHECK_ARG_RET(ctx, ctx, );

    ctx->imp_clb = clb;
    ctx->imp_clb_data = user_data;

    /* new import callback - reset latests flags (possibly new revisions available) */
    for (uint32_t v = 0; v < ctx->list.count; ++v) {
        struct lys_module *mod = ctx->list.objs[v];

        mod->latest_revision &= ~LYS_MOD_LATEST_IMPCLB;
        if (mod->parsed && mod->parsed->includes) {
            for (LY_ARRAY_COUNT_TYPE u = 0; u < LY_ARRAY_COUNT(mod->parsed->includes); ++u) {
                mod->parsed->includes[u].submodule->latest_revision &= ~LYS_MOD_LATEST_IMPCLB;
            }
        }
    }
}